

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaTargetGenerator *this,cmNinjaVars *vars)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar2;
  cmLocalNinjaGenerator *pcVar3;
  bool bVar4;
  TargetType TVar5;
  char *pcVar6;
  char *pcVar7;
  string *psVar8;
  mapped_type *pmVar9;
  bool bVar10;
  string pdbPath;
  string compilePdbPath;
  string local_118;
  string local_f8;
  key_type local_d8;
  cmNinjaVars *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_b8 = vars;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"MSVC_C_ARCHITECTURE_ID","");
  pcVar6 = cmMakefile::GetDefinition(this_00,&local_118);
  bVar10 = true;
  if (pcVar6 == (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"MSVC_CXX_ARCHITECTURE_ID","");
    pcVar7 = cmMakefile::GetDefinition(this_00,&local_50);
    if (pcVar7 == (char *)0x0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"MSVC_CUDA_ARCHITECTURE_ID","");
      pcVar7 = cmMakefile::GetDefinition(this_00,&local_70);
      bVar10 = pcVar7 != (char *)0x0;
      bVar4 = true;
      goto LAB_002ce860;
    }
  }
  bVar4 = false;
LAB_002ce860:
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar6 == (char *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  if (bVar10) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
              (&local_90,&this->super_cmCommonTargetGenerator);
    TVar5 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar5 == EXECUTABLE) ||
         (TVar5 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar5 == STATIC_LIBRARY)) ||
        (TVar5 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar5 == SHARED_LIBRARY)) ||
       (TVar5 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar5 == MODULE_LIBRARY)) {
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar8 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBDirectory(&local_f8,pcVar2,psVar8);
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_118);
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar8 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBName(&local_f8,pcVar2,psVar8);
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar3 = this->LocalGenerator;
    ConvertToNinjaPath(&local_b0,this,&local_118);
    cmOutputConverter::ConvertToOutputFormat
              (&local_f8,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_b0,SHELL);
    paVar1 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"TARGET_PDB","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b8,&local_d8);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = this->LocalGenerator;
    ConvertToNinjaPath(&local_b0,this,&local_90);
    cmOutputConverter::ConvertToOutputFormat
              (&local_f8,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_b0,SHELL);
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"TARGET_COMPILE_PDB","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b8,&local_d8);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    EnsureParentDirectoryExists(this,&local_118);
    EnsureParentDirectoryExists(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    return bVar10;
  }
  return bVar10;
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaVars& vars) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CUDA_ARCHITECTURE_ID")) {
    std::string pdbPath;
    std::string compilePdbPath = this->ComputeTargetCompilePDB();
    if (this->GeneratorTarget->GetType() == cmStateEnums::EXECUTABLE ||
        this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
      pdbPath = this->GeneratorTarget->GetPDBDirectory(this->GetConfigName());
      pdbPath += "/";
      pdbPath += this->GeneratorTarget->GetPDBName(this->GetConfigName());
    }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
      ConvertToNinjaPath(pdbPath), cmOutputConverter::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        ConvertToNinjaPath(compilePdbPath), cmOutputConverter::SHELL);

    EnsureParentDirectoryExists(pdbPath);
    EnsureParentDirectoryExists(compilePdbPath);
    return true;
  }
  return false;
}